

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::_::BuilderArena::LocalCapTable::extractCap(LocalCapTable *this,uint index)

{
  long lVar1;
  long *plVar2;
  ulong in_RDX;
  ClientHook *pCVar3;
  ClientHook *extraout_RDX;
  undefined4 in_register_00000034;
  Maybe<kj::Own<capnp::ClientHook>_> MVar4;
  Own<capnp::ClientHook> local_28;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,index) + 8);
  pCVar3 = (ClientHook *)(*(long *)(CONCAT44(in_register_00000034,index) + 0x10) - lVar1 >> 4);
  if (((ClientHook *)(in_RDX & 0xffffffff) < pCVar3) &&
     (plVar2 = *(long **)(lVar1 + 8 + (long)(in_RDX & 0xffffffff) * 0x10), plVar2 != (long *)0x0)) {
    (**(code **)(*plVar2 + 0x20))(&local_28);
    (this->super_CapTableBuilder).super_CapTableReader._vptr_CapTableReader =
         (_func_int **)local_28.disposer;
    (this->capTable).builder.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)local_28.ptr;
    local_28.ptr = (ClientHook *)0x0;
    kj::Own<capnp::ClientHook>::dispose(&local_28);
    pCVar3 = extraout_RDX;
  }
  else {
    (this->super_CapTableBuilder).super_CapTableReader._vptr_CapTableReader = (_func_int **)0x0;
    (this->capTable).builder.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
  }
  MVar4.ptr.ptr = pCVar3;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook>_>)MVar4.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> BuilderArena::LocalCapTable::extractCap(uint index) {
  if (index < capTable.size()) {
    return capTable[index].map([](kj::Own<ClientHook>& cap) { return cap->addRef(); });
  } else {
    return nullptr;
  }
}